

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

size_t __thiscall clickhouse::BufferedInput::DoRead(BufferedInput *this,void *buf,size_t len)

{
  bool bVar1;
  size_type sVar2;
  uchar *buf_00;
  size_t sVar3;
  ulong in_RDX;
  long in_RDI;
  void *in_stack_ffffffffffffffa8;
  InputStream *in_stack_ffffffffffffffb0;
  
  bVar1 = ArrayInput::Exhausted((ArrayInput *)0x1e6c46);
  if (bVar1) {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x28));
    if (sVar2 >> 1 < in_RDX) {
      sVar3 = InputStream::Read(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x1e6c8f);
      return sVar3;
    }
    buf_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1e6cb3);
    in_stack_ffffffffffffffb0 = *(InputStream **)(in_RDI + 8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1e6ccf);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x28));
    sVar3 = InputStream::Read(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x1e6cf4);
    ArrayInput::Reset((ArrayInput *)(in_RDI + 0x10),buf_00,sVar3);
  }
  sVar3 = InputStream::Read(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x1e6d1e);
  return sVar3;
}

Assistant:

size_t BufferedInput::DoRead(void* buf, size_t len) {
    if (array_input_.Exhausted()) {
        if (len > buffer_.size() / 2) {
            return slave_->Read(buf, len);
        }

        array_input_.Reset(
            buffer_.data(), slave_->Read(buffer_.data(), buffer_.size())
        );
    }

    return array_input_.Read(buf, len);
}